

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowCheckValue(Parse *pParse,int reg,int eCond)

{
  int iReg;
  Vdbe *p;
  int in_EDX;
  undefined4 in_ESI;
  Parse *in_RDI;
  int regString;
  int regZero;
  Vdbe *v;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Vdbe *in_stack_ffffffffffffffb0;
  Vdbe *p_00;
  int in_stack_ffffffffffffffb8;
  int p3;
  int in_stack_ffffffffffffffbc;
  int p2;
  Vdbe *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  
  p = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  iReg = sqlite3GetTempReg(in_RDI);
  sqlite3VdbeAddOp2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0)
  ;
  if (in_EDX < 3) {
    in_stack_ffffffffffffffc0 = p;
    sqlite3VdbeCurrentAddr(p);
    sqlite3VdbeAddOp2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                      0);
  }
  else {
    sqlite3GetTempReg(in_RDI);
    in_stack_ffffffffffffffa8 = -1;
    sqlite3VdbeAddOp4(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                      (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0
                      ,(char *)CONCAT44(in_stack_ffffffffffffffac,0xffffffff),
                      in_stack_ffffffffffffffd0);
    sqlite3VdbeCurrentAddr(p);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0
                      ,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    sqlite3VdbeChangeP5(p,0x53);
    in_ESI = in_stack_ffffffffffffffcc;
  }
  p3 = windowCheckValue::aOp[in_EDX];
  p_00 = p;
  p2 = iReg;
  sqlite3VdbeCurrentAddr(p);
  sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
                    (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
                    p2,p3);
  sqlite3VdbeChangeP5(p,0x43);
  sqlite3MayAbort(in_RDI);
  sqlite3VdbeAddOp2(p_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
  sqlite3VdbeAppendP4(in_stack_ffffffffffffffc0,(void *)CONCAT44(p2,p3),(int)((ulong)p_00 >> 0x20));
  sqlite3ReleaseTempReg(in_RDI,iReg);
  return;
}

Assistant:

static void windowCheckValue(Parse *pParse, int reg, int eCond){
  static const char *azErr[] = {
    "frame starting offset must be a non-negative integer",
    "frame ending offset must be a non-negative integer",
    "second argument to nth_value must be a positive integer",
    "frame starting offset must be a non-negative number",
    "frame ending offset must be a non-negative number",
  };
  static int aOp[] = { OP_Ge, OP_Ge, OP_Gt, OP_Ge, OP_Ge };
  Vdbe *v = sqlite3GetVdbe(pParse);
  int regZero = sqlite3GetTempReg(pParse);
  assert( eCond>=0 && eCond<ArraySize(azErr) );
  sqlite3VdbeAddOp2(v, OP_Integer, 0, regZero);
  if( eCond>=WINDOW_STARTING_NUM ){
    int regString = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp4(v, OP_String8, 0, regString, 0, "", P4_STATIC);
    sqlite3VdbeAddOp3(v, OP_Ge, regString, sqlite3VdbeCurrentAddr(v)+2, reg);
    sqlite3VdbeChangeP5(v, SQLITE_AFF_NUMERIC|SQLITE_JUMPIFNULL);
    VdbeCoverage(v);
    assert( eCond==3 || eCond==4 );
    VdbeCoverageIf(v, eCond==3);
    VdbeCoverageIf(v, eCond==4);
  }else{
    sqlite3VdbeAddOp2(v, OP_MustBeInt, reg, sqlite3VdbeCurrentAddr(v)+2);
    VdbeCoverage(v);
    assert( eCond==0 || eCond==1 || eCond==2 );
    VdbeCoverageIf(v, eCond==0);
    VdbeCoverageIf(v, eCond==1);
    VdbeCoverageIf(v, eCond==2);
  }
  sqlite3VdbeAddOp3(v, aOp[eCond], regZero, sqlite3VdbeCurrentAddr(v)+2, reg);
  sqlite3VdbeChangeP5(v, SQLITE_AFF_NUMERIC);
  VdbeCoverageNeverNullIf(v, eCond==0); /* NULL case captured by */
  VdbeCoverageNeverNullIf(v, eCond==1); /*   the OP_MustBeInt */
  VdbeCoverageNeverNullIf(v, eCond==2);
  VdbeCoverageNeverNullIf(v, eCond==3); /* NULL case caught by */
  VdbeCoverageNeverNullIf(v, eCond==4); /*   the OP_Ge */
  sqlite3MayAbort(pParse);
  sqlite3VdbeAddOp2(v, OP_Halt, SQLITE_ERROR, OE_Abort);
  sqlite3VdbeAppendP4(v, (void*)azErr[eCond], P4_STATIC);
  sqlite3ReleaseTempReg(pParse, regZero);
}